

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O2

int Cudd_zddPrintCover(DdManager *zdd,DdNode *node)

{
  uint uVar1;
  int *list;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = zdd->sizeZ;
  iVar3 = 0;
  if (((long)(int)uVar1 & 1U) == 0) {
    list = (int *)malloc((long)(int)uVar1 * 4);
    if (list == (int *)0x0) {
      zdd->errorCode = CUDD_MEMORY_OUT;
      iVar3 = 0;
    }
    else {
      uVar2 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar2;
      }
      for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        list[uVar2] = 3;
      }
      zddPrintCoverAux(zdd,node,0,list);
      free(list);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
Cudd_zddPrintCover(
  DdManager * zdd,
  DdNode * node)
{
    int         i, size;
    int         *list;

    size = (int)zdd->sizeZ;
    if (size % 2 != 0) return(0); /* number of variables should be even */
    list = ABC_ALLOC(int, size);
    if (list == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < size; i++) list[i] = 3; /* bogus value should disappear */
    zddPrintCoverAux(zdd, node, 0, list);
    ABC_FREE(list);
    return(1);

}